

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_bias_or_compare
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType pDataType;
  DataType DVar2;
  bool bVar3;
  ContextType CVar4;
  char *__s;
  DataType dataType;
  DataType dataType_00;
  long lVar5;
  DataType in_stack_fffffffffffff868;
  string shaderSource;
  allocator<char> local_759;
  long local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"texture: Invalid bias/compare type.",
             (allocator<char> *)&local_750);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  lVar5 = 0;
  do {
    if (lVar5 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar5];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_758 = lVar5;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,__s,&local_759);
      std::operator+(&shaderSource,"Verify shader: ",&local_750);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_750);
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        if (lVar5 != 0) {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x28,TYPE_FLOAT_VEC2,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x35,TYPE_FLOAT_VEC2,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3c,TYPE_FLOAT_VEC2,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar5);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x28,TYPE_FLOAT_VEC2,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_730,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_730);
        std::__cxx11::string::~string((string *)&local_730);
        std::__cxx11::string::~string((string *)&shaderSource);
        pDataType = *(DataType *)
                     ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                     lVar5);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,TYPE_FLOAT_VEC2,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,TYPE_FLOAT_VEC2,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,TYPE_FLOAT_VEC2,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,TYPE_FLOAT_VEC2,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,TYPE_FLOAT_VEC2,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar5 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2c,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x39,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_210,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_230,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_250,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar5 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_270,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_750,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::operator=((string *)&shaderSource,(string *)&local_750);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::string((string *)&local_6f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_6f0);
          std::__cxx11::string::~string((string *)&local_6f0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&local_750,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::operator=((string *)&shaderSource,(string *)&local_750);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::string((string *)&local_710,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_710);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_290,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_2d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_2f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_310,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_330,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar5 != 0) {
          DVar2 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_350,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_370,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT_VEC3,DVar2,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_390,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_3b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_3d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_3f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_410,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_430,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_450,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar5 != 0) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2f,TYPE_FLOAT_VEC3,
                     *(DataType *)
                      ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                      lVar5),in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_470,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_470);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,TYPE_FLOAT_VEC3,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_490,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,TYPE_FLOAT_VEC3,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_4b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar5 != 0) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x30,TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                      lVar5),in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_4d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_4d0);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_4f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,TYPE_FLOAT_VEC4,pDataType,
                   in_stack_fffffffffffff868);
        std::__cxx11::string::string((string *)&local_510,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&shaderSource);
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        if (bVar3) {
LAB_013632da:
          if (lVar5 != 0) {
            DVar2 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                     lVar5);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,DVar2,
                       in_stack_fffffffffffff868);
            std::__cxx11::string::string((string *)&local_550,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_550);
            std::__cxx11::string::~string((string *)&local_550);
            std::__cxx11::string::~string((string *)&shaderSource);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,DVar2,
                       in_stack_fffffffffffff868);
            std::__cxx11::string::string((string *)&local_570,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_570);
            std::__cxx11::string::~string((string *)&local_570);
            std::__cxx11::string::~string((string *)&shaderSource);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,DVar2,
                       in_stack_fffffffffffff868);
            std::__cxx11::string::string((string *)&local_590,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_590);
            std::__cxx11::string::~string((string *)&local_590);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_5b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_5b0);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,pDataType,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_5d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_5d0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_5f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_5f0);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,pDataType,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_610,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_610);
          std::__cxx11::string::~string((string *)&local_610);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_630,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_630);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,pDataType,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_650,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_650);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_530,(_anonymous_namespace_ *)0x2d,dataType);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          if (bVar3) goto LAB_013632da;
        }
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        if (bVar3) {
LAB_013635dc:
          if (lVar5 != 0) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x33,TYPE_FLOAT_VEC4,
                       *(DataType *)
                        ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                        lVar5),in_stack_fffffffffffff868);
            std::__cxx11::string::string((string *)&local_690,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x33,TYPE_FLOAT_VEC4,DVar1,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_6b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_6b0);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x33,TYPE_FLOAT_VEC4,pDataType,
                     in_stack_fffffffffffff868);
          std::__cxx11::string::string((string *)&local_6d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_6d0);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_670,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_670);
          std::__cxx11::string::~string((string *)&local_670);
          if (bVar3) goto LAB_013635dc;
        }
      }
      NegativeTestContext::endSection(ctx);
      lVar5 = local_758;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void texture_invalid_bias_or_compare (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid bias/compare type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, glu::TYPE_FLOAT_VEC2, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					shaderSource = genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]);
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, glu::TYPE_FLOAT_VEC3, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
				{
					std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}